

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString __thiscall despot::util::tinyxml::operator+(tinyxml *this,TiXmlString *a,TiXmlString *b)

{
  size_type sVar1;
  size_type sVar2;
  TiXmlString *b_local;
  TiXmlString *a_local;
  TiXmlString *tmp;
  
  TiXmlString::TiXmlString((TiXmlString *)this);
  sVar1 = TiXmlString::length(a);
  sVar2 = TiXmlString::length(b);
  TiXmlString::reserve((TiXmlString *)this,sVar1 + sVar2);
  TiXmlString::operator+=((TiXmlString *)this,a);
  TiXmlString::operator+=((TiXmlString *)this,b);
  return (TiXmlString)(Rep *)this;
}

Assistant:

TiXmlString operator +(const TiXmlString & a, const TiXmlString & b) {
	TiXmlString tmp;
	tmp.reserve(a.length() + b.length());
	tmp += a;
	tmp += b;
	return tmp;
}